

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O3

bool __thiscall
UnifiedRegex::BeginAssertionInst::Exec
          (BeginAssertionInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  int toGroupId;
  CharCount CVar1;
  PageAllocation *pPVar2;
  uint8 *puVar3;
  Program *pPVar4;
  size_t sVar5;
  code *pcVar6;
  bool bVar7;
  undefined4 *puVar8;
  uint8 *puVar9;
  size_t sVar10;
  
  if ((BeginAssertionInst *)*instPointer != this) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0x1123,"(instPointer == (uint8*)this)","instPointer == (uint8*)this");
    if (!bVar7) goto LAB_00efbbac;
    *puVar8 = 0;
  }
  if (((this->super_NegationMixin).isNegation == false) &&
     (toGroupId = (this->super_BodyGroupsMixin).maxBodyGroupId, -1 < toGroupId)) {
    Matcher::DoSaveInnerGroups
              (matcher,(this->super_BodyGroupsMixin).minBodyGroupId,toGroupId,false,input,contStack)
    ;
  }
  sVar10 = (assertionStack->
           super_ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL>).
           super_ContinuousPageStack<1UL>.bufferSize;
  if (sVar10 - (assertionStack->
               super_ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL>).
               super_ContinuousPageStack<1UL>.nextTop < 0x10) {
    ContinuousPageStack<1UL>::Resize((ContinuousPageStack<1UL> *)assertionStack,0x10);
    sVar10 = (assertionStack->
             super_ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL>).
             super_ContinuousPageStack<1UL>.bufferSize;
  }
  if (sVar10 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                       ,199,"(bufferSize)","bufferSize");
    if (!bVar7) goto LAB_00efbbac;
    *puVar8 = 0;
  }
  pPVar2 = (assertionStack->
           super_ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL>).
           super_ContinuousPageStack<1UL>.pageAllocation;
  sVar10 = (assertionStack->
           super_ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL>).
           super_ContinuousPageStack<1UL>.nextTop;
  (assertionStack->super_ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL>).
  super_ContinuousPageStack<1UL>.nextTop = sVar10 + 0x10;
  puVar3 = *instPointer;
  pPVar4 = (matcher->program).ptr;
  puVar9 = *(uint8 **)&pPVar4->rep;
  if ((puVar3 < puVar9) || (puVar9 + (pPVar4->rep).insts.instsLen <= puVar3)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x767,
                       "(inst >= program->rep.insts.insts && inst < program->rep.insts.insts + program->rep.insts.instsLen)"
                       ,
                       "inst >= program->rep.insts.insts && inst < program->rep.insts.insts + program->rep.insts.instsLen"
                      );
    if (!bVar7) goto LAB_00efbbac;
    *puVar8 = 0;
    puVar9 = *(uint8 **)&((matcher->program).ptr)->rep;
  }
  CVar1 = *inputOffset;
  sVar5 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
          super_ContinuousPageStack<1UL>.nextTop;
  *(int *)((long)&pPVar2[1].pageCount + sVar10) = (int)puVar3 - (int)puVar9;
  *(CharCount *)((long)&pPVar2[1].pageCount + sVar10 + 4) = CVar1;
  *(size_t *)((long)&pPVar2[1].segment + sVar10) = sVar5;
  sVar10 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
           super_ContinuousPageStack<1UL>.bufferSize;
  if (sVar10 - sVar5 < 0x18) {
    ContinuousPageStack<1UL>::Resize((ContinuousPageStack<1UL> *)contStack,0x18);
    sVar10 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
             super_ContinuousPageStack<1UL>.bufferSize;
  }
  if (sVar10 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                       ,199,"(bufferSize)","bufferSize");
    if (!bVar7) {
LAB_00efbbac:
      pcVar6 = (code *)invalidInstructionException();
      (*pcVar6)();
    }
    *puVar8 = 0;
  }
  pPVar2 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
           super_ContinuousPageStack<1UL>.pageAllocation;
  sVar10 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
           super_ContinuousPageStack<1UL>.nextTop;
  (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
  super_ContinuousPageStack<1UL>.nextTop = sVar10 + 0x18;
  *(size_t *)((long)&pPVar2[1].pageCount + sVar10) =
       (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
       topElementSize;
  (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).topElementSize =
       0x18;
  *(undefined1 *)((long)&pPVar2[2].pageCount + sVar10) = 6;
  *(undefined ***)((long)&pPVar2[1].segment + sVar10) = &PTR_Print_01543398;
  Matcher::PushStats(matcher,contStack,input);
  *instPointer = *instPointer + 0xe;
  return false;
}

Assistant:

inline bool BeginAssertionInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        Assert(instPointer == (uint8*)this);

        if (!isNegation)
        {
            // If the positive assertion binds some groups then on success any RestoreGroup continuations pushed
            // in the assertion body will be cut. Hence if the entire assertion is backtracked over we must restore
            // the current inner group bindings.
            matcher.SaveInnerGroups(minBodyGroupId, maxBodyGroupId, false, input, contStack);
        }

        PUSHA(assertionStack, AssertionInfo, matcher.InstPointerToLabel(instPointer), inputOffset, contStack.Position());
        PUSH(contStack, PopAssertionCont);
#if ENABLE_REGEX_CONFIG_OPTIONS
        matcher.PushStats(contStack, input);
#endif

        instPointer += sizeof(*this);
        return false;
    }